

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

size_t doctest::detail::my_strlen(char *in)

{
  char *pcVar1;
  char *pcVar2;
  char *temp;
  
  for (pcVar2 = in;
      (pcVar1 = (char *)0x0, pcVar2 != (char *)0x0 && (pcVar1 = pcVar2, *pcVar2 != '\0'));
      pcVar2 = pcVar2 + 1) {
  }
  return (long)pcVar1 - (long)in;
}

Assistant:

size_t my_strlen(const char* in) {
        const char* temp = in;
        while(temp && *temp)
            ++temp;
        return temp - in;
    }